

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O3

int __thiscall
google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(CodedInputStream *this)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  byte *pbVar5;
  ulong uVar6;
  uint uVar7;
  pair<unsigned_long,_bool> pVar8;
  
  pbVar2 = this->buffer_;
  pbVar5 = this->buffer_end_;
  if (((int)pbVar5 - (int)pbVar2 < 10) && ((pbVar5 <= pbVar2 || ((char)pbVar5[-1] < '\0')))) {
    pVar8 = ReadVarint64Fallback(this);
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return -1;
    }
    return -(uint)(pVar8.first >> 0x1f != 0) | (uint)pVar8.first;
  }
  bVar1 = *pbVar2;
  uVar3 = (uint)bVar1;
  uVar6 = 0;
  if ((char)bVar1 < '\0') {
    uVar3 = ((uint)bVar1 + (uint)pbVar2[1] * 0x80) - 0x80;
    if ((char)pbVar2[1] < '\0') {
      uVar3 = (uVar3 + (uint)pbVar2[2] * 0x4000) - 0x4000;
      if ((char)pbVar2[2] < '\0') {
        iVar4 = uVar3 + (uint)pbVar2[3] * 0x200000;
        uVar3 = iVar4 - 0x200000;
        if ((char)pbVar2[3] < '\0') {
          uVar3 = iVar4 + 0xefe00000;
          uVar7 = (uint)pbVar2[4];
          if ((char)pbVar2[4] < '\0') {
            uVar7 = (uVar7 + (uint)pbVar2[5] * 0x80) - 0x80;
            if ((char)pbVar2[5] < '\0') {
              uVar7 = (uVar7 + (uint)pbVar2[6] * 0x4000) - 0x4000;
              if ((char)pbVar2[6] < '\0') {
                iVar4 = uVar7 + (uint)pbVar2[7] * 0x200000;
                uVar7 = iVar4 - 0x200000;
                if ((char)pbVar2[7] < '\0') {
                  uVar7 = iVar4 + 0xefe00000;
                  bVar1 = pbVar2[8];
                  uVar6 = (ulong)bVar1;
                  if ((char)bVar1 < '\0') {
                    if ((char)pbVar2[9] < '\0') {
                      return -1;
                    }
                    pbVar5 = pbVar2 + 10;
                    uVar6 = (ulong)(((uint)bVar1 + (uint)pbVar2[9] * 0x80) - 0x80);
                  }
                  else {
                    pbVar5 = pbVar2 + 9;
                  }
                }
                else {
                  pbVar5 = pbVar2 + 8;
                }
              }
              else {
                pbVar5 = pbVar2 + 7;
              }
            }
            else {
              pbVar5 = pbVar2 + 6;
            }
          }
          else {
            pbVar5 = pbVar2 + 5;
          }
          goto LAB_002e826f;
        }
        pbVar5 = pbVar2 + 4;
      }
      else {
        pbVar5 = pbVar2 + 3;
      }
    }
    else {
      pbVar5 = pbVar2 + 2;
    }
  }
  else {
    pbVar5 = pbVar2 + 1;
  }
  uVar7 = 0;
LAB_002e826f:
  if (0x7fffffff < (uVar6 << 0x38 | (ulong)uVar7 << 0x1c | (ulong)uVar3)) {
    return -1;
  }
  this->buffer_ = pbVar5;
  return (uint)((ulong)uVar7 << 0x1c) | uVar3;
}

Assistant:

inline int CodedInputStream::BufferSize() const {
  return static_cast<int>(buffer_end_ - buffer_);
}